

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::draw_horizontal_line
          (Image *this,ssize_t x1,ssize_t x2,ssize_t y,ssize_t dash_length,uint64_t r,uint64_t g,
          uint64_t b,uint64_t a)

{
  if (x1 <= x2) {
    do {
      if ((dash_length == 0) || ((x1 / dash_length & 1U) == 0)) {
        write_pixel(this,x1,y,r,g,b,a);
      }
      x1 = x1 + 1;
    } while (x2 + 1 != x1);
  }
  return;
}

Assistant:

void Image::draw_horizontal_line(ssize_t x1, ssize_t x2, ssize_t y,
    ssize_t dash_length, uint64_t r, uint64_t g, uint64_t b, uint64_t a) {

  for (ssize_t x = x1; x <= x2; x++) {
    if (dash_length && ((x / dash_length) & 1)) {
      continue;
    }
    try {
      this->write_pixel(x, y, r, g, b, a);
    } catch (const out_of_range& e) {
      break;
    }
  }
}